

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type,
          bool should_consider_suffix)

{
  Type local_28;
  
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  else if (type->base_type == BASE_TYPE_ARRAY) {
    local_28.base_type = type->element;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    GenType_abi_cxx11_(__return_storage_ptr__,this,&local_28,false);
  }
  else {
    GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type,should_consider_suffix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenType(const Type &type,
                      const bool should_consider_suffix = false) const {
    return IsScalar(type.base_type) ? GenTypeBasic(type)
           : IsArray(type)          ? GenType(type.VectorType())
                           : GenTypePointer(type, should_consider_suffix);
  }